

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double nifti_stat2hzscore(double val,int code,double p1,double p2,double p3)

{
  double dVar1;
  pqpair pVar2;
  double q;
  double p;
  double local_10;
  double local_8;
  
  pVar2 = stat2pq(val,code,p1,p2,p3);
  local_10 = (1.0 - pVar2.p) * 0.5;
  local_8 = (pVar2.p + 1.0) * 0.5;
  if (local_8 <= 0.0) {
    dVar1 = -9.99e+37;
  }
  else if (local_10 <= 0.0) {
    dVar1 = 9.99e+37;
  }
  else {
    dVar1 = dinvnr(&local_8,&local_10);
  }
  return dVar1;
}

Assistant:

double nifti_stat2hzscore( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq ;

   pq = stat2pq( val, code, p1,p2,p3 ) ;                    /* find cdf */
   pq.q = 0.5*(1.0-pq.p) ; pq.p = 0.5*(1.0+pq.p) ;          /* mangle it */
   return normal_pq2s( pq ) ;                               /* find z  */
}